

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdl_controller.cpp
# Opt level: O3

void __thiscall
r_exec::PMDLController::register_predicted_goal_outcome
          (PMDLController *this,Fact *goal,HLPBindingMap *bm,Fact *f_imdl,bool success,
          bool injected_goal)

{
  atomic_int_fast64_t *paVar1;
  ulong uVar2;
  Sim *pSVar3;
  char cVar4;
  _Fact *this_00;
  Goal *this_01;
  _Fact *this_02;
  uint64_t deadline;
  long lVar5;
  long lVar6;
  ulong uVar7;
  Sim *this_03;
  GMonitor *this_04;
  Fact *s;
  undefined7 in_register_00000081;
  ulong uVar8;
  uint64_t thz;
  undefined1 auVar9 [16];
  double dVar10;
  
  if ((int)CONCAT71(in_register_00000081,success) != 0) {
    (**(code **)((long)(goal->super__Fact).super_LObject.
                       super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
                       super__Object._vptr__Object + 0x78))(goal);
    return;
  }
  if (injected_goal) {
    s = goal;
    cVar4 = (**(code **)((long)(goal->super__Fact).super_LObject.
                               super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
                               super_Code.super__Object._vptr__Object + 0x70))(goal);
    if (cVar4 == '\0') {
      return;
    }
    this_00 = (_Fact *)Fact::operator_new((Fact *)0x150,(size_t)s);
    Fact::Fact((Fact *)this_00,goal);
    this_01 = _Fact::get_goal(this_00);
    this_02 = Goal::get_target(this_01);
    deadline = _Fact::get_before(this_02);
    lVar5 = (*Now)();
    lVar6 = r_code::Mem::Get();
    uVar2 = *(ulong *)(lVar6 + 0x38);
    lVar6 = r_code::Mem::Get();
    lVar5 = deadline - lVar5;
    auVar9._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar9._0_8_ = lVar5;
    auVar9._12_4_ = 0x45300000;
    dVar10 = ((auVar9._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) *
             *(double *)(lVar6 + 0x48);
    uVar7 = (ulong)dVar10;
    uVar7 = (long)(dVar10 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7;
    uVar8 = uVar7 - uVar2;
    if (uVar7 < uVar2 || uVar8 == 0) {
      thz = 0;
    }
    else {
      lVar5 = r_code::Mem::Get();
      thz = *(ulong *)(lVar5 + 0x40);
      if (uVar8 < *(ulong *)(lVar5 + 0x40)) {
        thz = uVar8;
      }
    }
    this_03 = (Sim *)operator_new(0x50);
    Sim::Sim(this_03,SIM_ROOT,thz,
             (Fact *)(this_01->sim).object[2].refCount.super___atomic_base<long>._M_i,false,
             (Controller *)this);
    pSVar3 = (Sim *)(this_01->sim).object;
    if (pSVar3 != this_03) {
      if (pSVar3 != (Sim *)0x0) {
        LOCK();
        paVar1 = &(pSVar3->super__Object).refCount;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
        UNLOCK();
        if ((pSVar3->super__Object).refCount.super___atomic_base<long>._M_i < 1) {
          (*(pSVar3->super__Object)._vptr__Object[1])();
        }
      }
      (this_01->sim).object = (_Object *)this_03;
      LOCK();
      paVar1 = &(this_03->super__Object).refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
    }
    this_04 = (GMonitor *)operator_new(200);
    GMonitor::GMonitor(this_04,this,&bm->super_BindingMap,deadline,thz,(Fact *)this_00,f_imdl,
                       (_Fact *)0x0);
    add_g_monitor(this,(_GMonitor *)this_04);
    goal = (Fact *)this_00;
  }
  inject_goal(this,bm,goal,f_imdl);
  return;
}

Assistant:

void PMDLController::register_predicted_goal_outcome(Fact *goal, HLPBindingMap *bm, Fact *f_imdl, bool success, bool injected_goal)   // called only for SIM_COMMITTED mode.
{
    if (success) {
        goal->invalidate();    // monitor still running to detect failures (actual or predicted).
    } else {
        if (!injected_goal) { // the goal has not been injected; monitor still running.
            inject_goal(bm, goal, f_imdl);
        } else {
            if (goal->is_invalidated()) { // the only case when the goal can be invalidated here is when a predicted failure follows a predicted success.
                Fact *new_goal = new Fact(goal);
                Goal *g = new_goal->get_goal();
                uint64_t deadline = g->get_target()->get_before();
                uint64_t sim_thz = get_sim_thz(Now(), deadline);
                Sim *new_sim = new Sim(SIM_ROOT, sim_thz, g->sim->super_goal, false, this);
                g->sim = new_sim;
                add_g_monitor(new GMonitor(this, bm, deadline, sim_thz, new_goal, f_imdl, nullptr));
                inject_goal(bm, new_goal, f_imdl);
            }
        }
    }
}